

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int select_off(obj *otmp)

{
  undefined1 *puVar1;
  obj *poVar2;
  uint uVar3;
  int extraout_EAX;
  int iVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  obj **in_RAX;
  you *extraout_RAX;
  you *extraout_RAX_00;
  char *pcVar5;
  obj **ppoVar6;
  char *pcVar7;
  char *line;
  char buf [256];
  char local_138 [264];
  
  if (otmp == (obj *)0x0) goto LAB_0018683b;
  local_138[0] = '\0';
  if ((uright == otmp) || (uleft == otmp)) {
    if ((~(youmonst.data)->mflags1 & 0x6000) == 0) {
      pline("The ring is stuck.");
      return extraout_EAX;
    }
    ppoVar6 = &uwep;
    iVar4 = welded(uwep);
    if ((iVar4 == 0) ||
       ((uright != otmp &&
        (((byte)(uwep->oclass | 4U) != 6 || ((objects[uwep->otyp].field_0x11 & 1) == 0)))))) {
      ppoVar6 = &uarmg;
      if ((uarmg == (obj *)0x0) || ((uarmg->field_0x4a & 1) == 0)) goto LAB_001862b9;
      pcVar7 = "take off your %s";
      pcVar5 = "gloves";
    }
    else {
      pcVar5 = body_part(6);
      pcVar7 = "free a weapon %s";
    }
    sprintf(local_138,pcVar7,pcVar5);
    poVar2 = *ppoVar6;
    if (poVar2 != (obj *)0x0) {
      pline("You cannot %s to remove the ring.",local_138);
      puVar1 = &poVar2->field_0x4a;
      *puVar1 = *puVar1 | 0x40;
      in_RAX = (obj **)extraout_RAX;
      goto LAB_0018683b;
    }
  }
LAB_001862b9:
  if (uarmg == otmp) {
    iVar4 = welded(uwep);
    if (iVar4 != 0) {
      pcVar5 = "weapon";
      if (((uwep->oclass == '\x02') && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
         (pcVar5 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
        pcVar5 = "sword";
      }
      pline("You are unable to take off your %s while wielding that %s.","gloves",pcVar5);
      in_RAX = &uwep->nobj;
      *(uint *)&uwep->field_0x4a = *(uint *)&uwep->field_0x4a | 0x40;
      goto LAB_0018683b;
    }
    if (u.uprops[0x29].intrinsic != 0) {
      pcVar5 = body_part(3);
      pcVar7 = makeplural(pcVar5);
      line = "You can\'t take off the slippery %s with your slippery %s.";
      pcVar5 = "gloves";
      goto LAB_001865f3;
    }
  }
  if (uarmf == otmp) {
    if (u.utraptype == 0 && u.utrap != 0) {
      pcVar5 = body_part(5);
      pline("The bear trap prevents you from pulling your %s out.",pcVar5);
      return extraout_EAX_00;
    }
    if (u.utraptype == 4 && u.utrap != 0) {
      pcVar5 = surface((int)u.ux,(int)u.uy);
      pcVar7 = body_part(5);
      pcVar7 = makeplural(pcVar7);
      line = "You are stuck in the %s, and cannot pull your %s out.";
LAB_001865f3:
      pline(line,pcVar5,pcVar7);
      return extraout_EAX_01;
    }
  }
  in_RAX = &uarm->nobj;
  if (uarmu == otmp || uarm == otmp) {
    ppoVar6 = &uarmc;
    if ((uarmc == (obj *)0x0) || ((uarmc->field_0x4a & 1) == 0)) {
      if ((uarm == (obj *)0x0 || uarmu != otmp) || ((uarm->field_0x4a & 1) == 0)) {
        ppoVar6 = &uwep;
        uVar3 = welded(uwep);
        in_RAX = (obj **)(ulong)uVar3;
        if (uVar3 != 0) {
          in_RAX = &uwep->nobj;
          if ((byte)(uwep->oclass | 4U) == 6) {
            in_RAX = (obj **)(long)uwep->otyp;
            if ((objects[(long)in_RAX].field_0x11 & 1) != 0) {
              if ((uwep->oclass == 2) && ((byte)(objects[(long)in_RAX].oc_subtyp - 5U) < 6)) {
                pcVar5 = "sword";
              }
              else {
                pcVar5 = "weapon";
                if (uwep->otyp == 0x1c) {
                  pcVar5 = "axe";
                }
              }
              pcVar7 = "release your %s";
              goto LAB_0018665f;
            }
          }
        }
        goto LAB_0018669c;
      }
      uVar3 = sprintf(local_138,"remove your %s","suit");
      ppoVar6 = &uarm;
    }
    else {
      pcVar5 = cloak_simple_name(uarmc);
      pcVar7 = "remove your %s";
LAB_0018665f:
      uVar3 = sprintf(local_138,pcVar7,pcVar5);
    }
    in_RAX = (obj **)(ulong)uVar3;
    poVar2 = *ppoVar6;
    if (poVar2 != (obj *)0x0) {
      pcVar5 = xname(otmp);
      pcVar5 = the(pcVar5);
      pline("You cannot %s to take off %s.",local_138,pcVar5);
      puVar1 = &poVar2->field_0x4a;
      *puVar1 = *puVar1 | 0x40;
      in_RAX = (obj **)extraout_RAX_00;
      goto LAB_0018683b;
    }
  }
LAB_0018669c:
  if ((uquiver != otmp) && ((uswapwep != otmp || (in_RAX = (obj **)&u, u.twoweap != '\0')))) {
    uVar3 = cursed(otmp);
    in_RAX = (obj **)(ulong)uVar3;
    if (uVar3 != 0) goto LAB_0018683b;
  }
  if (uarm == otmp) {
    takeoff_mask._0_1_ = (byte)takeoff_mask | 1;
  }
  else {
    in_RAX = &uarmc;
    if (uarmc == otmp) {
      takeoff_mask._0_1_ = (byte)takeoff_mask | 2;
    }
    else {
      in_RAX = &uarmf;
      if (uarmf == otmp) {
        takeoff_mask._0_1_ = (byte)takeoff_mask | 0x20;
      }
      else if (uarmg == otmp) {
        takeoff_mask._0_1_ = (byte)takeoff_mask | 0x10;
      }
      else {
        in_RAX = &uarmh;
        if (uarmh == otmp) {
          takeoff_mask._0_1_ = (byte)takeoff_mask | 4;
        }
        else {
          in_RAX = &uarms;
          if (uarms == otmp) {
            takeoff_mask._0_1_ = (byte)takeoff_mask | 8;
          }
          else {
            in_RAX = &uarmu;
            if (uarmu == otmp) {
              takeoff_mask._0_1_ = (byte)takeoff_mask | 0x40;
            }
            else if (uleft == otmp) {
              takeoff_mask._2_1_ = takeoff_mask._2_1_ | 2;
            }
            else if (uright == otmp) {
              takeoff_mask._2_1_ = takeoff_mask._2_1_ | 4;
            }
            else {
              in_RAX = &uamul;
              if (uamul == otmp) {
                takeoff_mask._2_1_ = takeoff_mask._2_1_ | 1;
              }
              else {
                in_RAX = &ublindf;
                if (ublindf == otmp) {
                  takeoff_mask._2_1_ = takeoff_mask._2_1_ | 8;
                }
                else {
                  in_RAX = &uwep;
                  if (uwep == otmp) {
                    takeoff_mask._1_1_ = takeoff_mask._1_1_ | 1;
                  }
                  else {
                    in_RAX = &uswapwep;
                    if (uswapwep == otmp) {
                      takeoff_mask._1_1_ = takeoff_mask._1_1_ | 4;
                    }
                    else {
                      if (uquiver != otmp) {
                        pcVar5 = doname(otmp);
                        warning("select_off: %s???",pcVar5);
                        return extraout_EAX_02;
                      }
                      takeoff_mask._1_1_ = takeoff_mask._1_1_ | 2;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0018683b:
  return (int)in_RAX;
}

Assistant:

static int select_off(struct obj *otmp)
{
	struct obj *why;
	char buf[BUFSZ];

	if (!otmp) return 0;
	*buf = '\0';			/* lint suppresion */

	/* special ring checks */
	if (otmp == uright || otmp == uleft) {
	    if (nolimbs(youmonst.data)) {
		pline("The ring is stuck.");
		return 0;
	    }
	    why = 0;	/* the item which prevents ring removal */
	    if (welded(uwep) && (otmp == uright || bimanual(uwep))) {
		sprintf(buf, "free a weapon %s", body_part(HAND));
		why = uwep;
	    } else if (uarmg && uarmg->cursed) {
		sprintf(buf, "take off your %s", c_gloves);
		why = uarmg;
	    }
	    if (why) {
		pline("You cannot %s to remove the ring.", buf);
		why->bknown = TRUE;
		return 0;
	    }
	}
	/* special glove checks */
	if (otmp == uarmg) {
	    if (welded(uwep)) {
		pline("You are unable to take off your %s while wielding that %s.",
		    c_gloves, is_sword(uwep) ? c_sword : c_weapon);
		uwep->bknown = TRUE;
		return 0;
	    } else if (Glib) {
		pline("You can't take off the slippery %s with your slippery %s.",
			 c_gloves, makeplural(body_part(FINGER)));
		return 0;
	    }
	}
	/* special boot checks */
	if (otmp == uarmf) {
	    if (u.utrap && u.utraptype == TT_BEARTRAP) {
		pline("The bear trap prevents you from pulling your %s out.",
			  body_part(FOOT));
		return 0;
	    } else if (u.utrap && u.utraptype == TT_INFLOOR) {
		pline("You are stuck in the %s, and cannot pull your %s out.",
		    surface(u.ux, u.uy), makeplural(body_part(FOOT)));
		return 0;
	    }
	}
	/* special suit and shirt checks */
	if (otmp == uarm || otmp == uarmu) {
	    why = 0;	/* the item which prevents disrobing */
	    if (uarmc && uarmc->cursed) {
		sprintf(buf, "remove your %s", cloak_simple_name(uarmc));
		why = uarmc;
	    } else if (otmp == uarmu && uarm && uarm->cursed) {
		sprintf(buf, "remove your %s", c_suit);
		why = uarm;
	    } else if (welded(uwep) && bimanual(uwep)) {
		sprintf(buf, "release your %s",
			is_sword(uwep) ? c_sword :
			(uwep->otyp == BATTLE_AXE) ? c_axe : c_weapon);
		why = uwep;
	    }
	    if (why) {
		pline("You cannot %s to take off %s.", buf, the(xname(otmp)));
		why->bknown = TRUE;
		return 0;
	    }
	}
	/* basic curse check */
	if (otmp == uquiver || (otmp == uswapwep && !u.twoweap)) {
	    ;	/* some items can be removed even when cursed */
	} else {
	    /* otherwise, this is fundamental */
	    if (cursed(otmp)) return 0;
	}

	if (otmp == uarm) takeoff_mask |= WORN_ARMOR;
	else if (otmp == uarmc) takeoff_mask |= WORN_CLOAK;
	else if (otmp == uarmf) takeoff_mask |= WORN_BOOTS;
	else if (otmp == uarmg) takeoff_mask |= WORN_GLOVES;
	else if (otmp == uarmh) takeoff_mask |= WORN_HELMET;
	else if (otmp == uarms) takeoff_mask |= WORN_SHIELD;
	else if (otmp == uarmu) takeoff_mask |= WORN_SHIRT;
	else if (otmp == uleft) takeoff_mask |= LEFT_RING;
	else if (otmp == uright) takeoff_mask |= RIGHT_RING;
	else if (otmp == uamul) takeoff_mask |= WORN_AMUL;
	else if (otmp == ublindf) takeoff_mask |= WORN_BLINDF;
	else if (otmp == uwep) takeoff_mask |= W_WEP;
	else if (otmp == uswapwep) takeoff_mask |= W_SWAPWEP;
	else if (otmp == uquiver) takeoff_mask |= W_QUIVER;

	else warning("select_off: %s???", doname(otmp));

	return 0;
}